

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  bool bVar304;
  undefined8 uVar305;
  int iVar306;
  undefined4 extraout_EAX;
  ulong uVar307;
  ulong uVar308;
  _func_void_char_ptr_void_ptr *p_Var309;
  secp256k1_context *psVar310;
  ulong uVar311;
  secp256k1_context *a;
  char *extraout_RDX;
  size_t __n;
  ulong uVar312;
  secp256k1_fe *psVar313;
  secp256k1_context *r;
  secp256k1_context *a_00;
  ulong uVar314;
  _func_void_char_ptr_void_ptr *p_Var315;
  secp256k1_fe *psVar316;
  secp256k1_context *a_01;
  ulong uVar317;
  secp256k1_context *ctx;
  ulong uVar318;
  secp256k1_context *psVar319;
  undefined1 *puVar320;
  secp256k1_context *psVar321;
  secp256k1_context *b;
  secp256k1_context *psVar322;
  bool bVar323;
  undefined1 auVar324 [16];
  uint64_t tmp1_2;
  uint64_t tmp2;
  secp256k1_fe u1;
  secp256k1_fe s;
  secp256k1_fe d;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  secp256k1_fe g;
  uchar auStack_408 [72];
  secp256k1_context *psStack_3c0;
  secp256k1_context *psStack_3b8;
  ulong uStack_3b0;
  secp256k1_context *psStack_3a8;
  secp256k1_context *psStack_3a0;
  secp256k1_context *psStack_398;
  int iStack_38c;
  secp256k1_context *psStack_388;
  secp256k1_context *psStack_380;
  ulong uStack_378;
  secp256k1_context *psStack_370;
  secp256k1_context *psStack_368;
  undefined1 auStack_360 [120];
  ulong uStack_2e8;
  ulong uStack_2e0;
  ulong uStack_2d8;
  secp256k1_context *psStack_2d0;
  ulong uStack_2c8;
  _func_void_char_ptr_void_ptr *p_Stack_290;
  void *pvStack_288;
  ulong uStack_280;
  ulong uStack_278;
  ulong uStack_270;
  int iStack_268;
  int iStack_260;
  undefined1 auStack_250 [56];
  ulong uStack_218;
  ulong uStack_210;
  ulong uStack_208;
  undefined1 *puStack_200;
  uint64_t uStack_1f8;
  undefined4 uStack_1f0;
  secp256k1_fe *psStack_1e8;
  _func_void_char_ptr_void_ptr *p_Stack_1e0;
  ulong uStack_1d8;
  _func_void_char_ptr_void_ptr *p_Stack_1d0;
  void *pvStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *local_1b0;
  secp256k1_fe *local_1a8;
  long local_1a0;
  undefined1 local_198 [56];
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  secp256k1_context *local_148;
  uint64_t local_140;
  undefined1 local_138 [136];
  uint64_t uStack_b0;
  secp256k1_fe local_a0;
  void *local_70;
  _func_void_char_ptr_void_ptr *local_68;
  secp256k1_fe local_60;
  
  local_138._48_8_ = u->n[0];
  local_138._56_8_ = u->n[1];
  local_138._64_8_ = u->n[2];
  local_138._72_8_ = u->n[3];
  local_138._80_8_ = u->n[4];
  local_138._88_4_ = u->magnitude;
  local_138._92_4_ = u->normalized;
  psStack_1c0 = (secp256k1_fe *)0x12441e;
  secp256k1_fe_verify((secp256k1_fe *)(local_138 + 0x30));
  local_1a0 = 0x1000003d1;
  uVar307 = ((ulong)local_138._80_8_ >> 0x30) * 0x1000003d1 + local_138._48_8_;
  if (((uVar307 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar307 & 0xfffffffffffff) == 0)) {
    uVar311 = (uVar307 >> 0x34) + local_138._56_8_;
    uVar314 = (uVar311 >> 0x34) + local_138._64_8_;
    uVar317 = (uVar314 >> 0x34) + local_138._72_8_;
    uVar318 = (uVar317 >> 0x34) + (local_138._80_8_ & 0xffffffffffff);
    if (((uVar311 | uVar307 | uVar314 | uVar317) & 0xfffffffffffff) == 0 && uVar318 == 0)
    goto LAB_0012525c;
    if (((uVar307 | 0x1000003d0) & uVar311 & uVar314 & uVar317 & (uVar318 ^ 0xf000000000000)) ==
        0xfffffffffffff) goto LAB_0012525c;
  }
  do {
    psStack_1c0 = (secp256k1_fe *)0x1244ea;
    secp256k1_fe_verify(t);
    if (t->magnitude < 9) {
      uVar307 = t->n[0];
      uVar311 = t->n[1];
      uVar314 = t->n[2];
      uVar317 = t->n[3];
      uVar318 = t->n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar307 * 2;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uVar317;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar311 * 2;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar314;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar318;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar318;
      uVar308 = SUB168(auVar5 * auVar145,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar308 & 0xfffffffffffff;
      auVar3 = auVar4 * auVar144 + auVar3 * auVar143 + auVar6 * ZEXT816(0x1000003d10);
      uVar312 = auVar3._0_8_;
      local_60.n[0] = uVar312 & 0xfffffffffffff;
      auVar255._8_8_ = 0;
      auVar255._0_8_ = uVar312 >> 0x34 | auVar3._8_8_ << 0xc;
      psVar316 = (secp256k1_fe *)(uVar318 * 2);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar307;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = psVar316;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar311 * 2;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar317;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar314;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar314;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar308 >> 0x34 | SUB168(auVar5 * auVar145,8) << 0xc;
      auVar3 = auVar7 * auVar146 + auVar255 + auVar8 * auVar147 + auVar9 * auVar148 +
               auVar10 * ZEXT816(0x1000003d10);
      uVar318 = auVar3._0_8_;
      auVar256._8_8_ = 0;
      auVar256._0_8_ = uVar318 >> 0x34 | auVar3._8_8_ << 0xc;
      local_a0.n[0] = (uVar318 & 0xfffffffffffff) >> 0x30;
      local_138._0_8_ = uVar318 & 0xffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar307;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar307;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar311;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = psVar316;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar314 * 2;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar317;
      auVar3 = auVar12 * auVar150 + auVar256 + auVar13 * auVar151;
      uVar318 = auVar3._0_8_;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = uVar318 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = (uVar318 & 0xfffffffffffff) << 4 | local_a0.n[0];
      auVar3 = auVar11 * auVar149 + ZEXT816(0x1000003d1) * auVar152;
      uVar318 = auVar3._0_8_;
      local_138._96_8_ = uVar318 & 0xfffffffffffff;
      auVar257._8_8_ = 0;
      auVar257._0_8_ = uVar318 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar307 * 2;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar311;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar314;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = psVar316;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar317;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = uVar317;
      auVar4 = auVar15 * auVar154 + auVar258 + auVar16 * auVar155;
      uVar318 = auVar4._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar318 & 0xfffffffffffff;
      auVar3 = auVar14 * auVar153 + auVar257 + auVar17 * ZEXT816(0x1000003d10);
      uVar308 = auVar3._0_8_;
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uVar318 >> 0x34 | auVar4._8_8_ << 0xc;
      local_138._104_8_ = uVar308 & 0xfffffffffffff;
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uVar308 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar307 * 2;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = uVar314;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar311;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = uVar311;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar317;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = psVar316;
      auVar260 = auVar20 * auVar158 + auVar260;
      uVar307 = auVar260._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar307 & 0xfffffffffffff;
      auVar3 = auVar18 * auVar156 + auVar259 + auVar19 * auVar157 + auVar21 * ZEXT816(0x1000003d10);
      uVar311 = auVar3._0_8_;
      local_138._112_8_ = uVar311 & 0xfffffffffffff;
      auVar261._8_8_ = 0;
      auVar261._0_8_ =
           (_func_void_char_ptr_void_ptr *)(local_60.n[0] + (uVar311 >> 0x34 | auVar3._8_8_ << 0xc))
      ;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar307 >> 0x34 | auVar260._8_8_ << 0xc;
      auVar261 = auVar22 * ZEXT816(0x1000003d10) + auVar261;
      uVar307 = auVar261._0_8_;
      local_138._120_8_ = uVar307 & 0xfffffffffffff;
      local_138._128_8_ = local_138._0_8_ + (uVar307 >> 0x34 | auVar261._8_8_ << 0xc);
      uStack_b0 = 1;
      psStack_1c0 = (secp256k1_fe *)0x124757;
      local_1b0 = xn;
      local_1a8 = xd;
      secp256k1_fe_verify((secp256k1_fe *)(local_138 + 0x60));
      psStack_1c0 = (secp256k1_fe *)0x12475f;
      secp256k1_fe_verify(t);
      uVar307 = (t->n[4] >> 0x30) * local_1a0 + t->n[0];
      if (((uVar307 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar307 & 0xfffffffffffff) == 0)) {
        uVar311 = (uVar307 >> 0x34) + t->n[1];
        uVar314 = (uVar311 >> 0x34) + t->n[2];
        uVar317 = (uVar314 >> 0x34) + t->n[3];
        uVar318 = (uVar317 >> 0x34) + (t->n[4] & 0xffffffffffff);
        if ((((uVar311 | uVar307 | uVar314 | uVar317) & 0xfffffffffffff) == 0 && uVar318 == 0) ||
           (((uVar307 | 0x1000003d0) & uVar311 & uVar314 & uVar317 & (uVar318 ^ 0xf000000000000)) ==
            0xfffffffffffff)) {
          local_138._128_8_ = 0;
          uStack_b0._0_4_ = 1;
          uStack_b0._4_4_ = 1;
          local_138._112_8_ = 0;
          local_138._120_8_ = 0;
          local_138._96_8_ = 1;
          local_138._104_8_ = 0;
        }
      }
      psStack_1c0 = (secp256k1_fe *)0x12481d;
      secp256k1_fe_verify((secp256k1_fe *)(local_138 + 0x30));
      xn = psVar316;
      xd = (secp256k1_fe *)0xfffffffffffff;
      if (8 < (int)local_138._88_4_) goto LAB_0012523e;
      t = (secp256k1_fe *)(local_198 + 0x30);
      xd = (secp256k1_fe *)0xfffffffffffff;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_138._48_8_ * 2;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_138._72_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_138._56_8_ * 2;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = local_138._64_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_138._80_8_;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_138._80_8_;
      uVar311 = SUB168(auVar25 * auVar161,0);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar311 & 0xfffffffffffff;
      auVar3 = auVar24 * auVar160 + auVar23 * auVar159 + auVar26 * ZEXT816(0x1000003d10);
      uVar307 = auVar3._0_8_;
      local_60.n[0] = uVar307 & 0xfffffffffffff;
      auVar262._8_8_ = 0;
      auVar262._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar307 = local_138._80_8_ * 2;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_138._48_8_;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = uVar307;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_138._56_8_ * 2;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_138._72_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_138._64_8_;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_138._64_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar311 >> 0x34 | SUB168(auVar25 * auVar161,8) << 0xc;
      auVar3 = auVar27 * auVar162 + auVar262 + auVar28 * auVar163 + auVar29 * auVar164 +
               auVar30 * ZEXT816(0x1000003d10);
      uVar311 = auVar3._0_8_;
      auVar263._8_8_ = 0;
      auVar263._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      local_a0.n[0] = (uVar311 & 0xfffffffffffff) >> 0x30;
      local_138._0_8_ = uVar311 & 0xffffffffffff;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_138._48_8_;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_138._48_8_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_138._56_8_;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = uVar307;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_138._64_8_ * 2;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_138._72_8_;
      auVar3 = auVar32 * auVar166 + auVar263 + auVar33 * auVar167;
      uVar311 = auVar3._0_8_;
      auVar265._8_8_ = 0;
      auVar265._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = (uVar311 & 0xfffffffffffff) << 4 | local_a0.n[0];
      auVar3 = auVar31 * auVar165 + ZEXT816(0x1000003d1) * auVar168;
      uVar311 = auVar3._0_8_;
      local_198._48_8_ = uVar311 & 0xfffffffffffff;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_138._48_8_ * 2;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_138._56_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_138._64_8_;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = uVar307;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_138._72_8_;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_138._72_8_;
      auVar4 = auVar35 * auVar170 + auVar265 + auVar36 * auVar171;
      uVar311 = auVar4._0_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar311 & 0xfffffffffffff;
      auVar3 = auVar34 * auVar169 + auVar264 + auVar37 * ZEXT816(0x1000003d10);
      uVar314 = auVar3._0_8_;
      auVar267._8_8_ = 0;
      auVar267._0_8_ = uVar311 >> 0x34 | auVar4._8_8_ << 0xc;
      uStack_160 = uVar314 & 0xfffffffffffff;
      auVar266._8_8_ = 0;
      auVar266._0_8_ = uVar314 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_138._48_8_ * 2;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = local_138._64_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_138._56_8_;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_138._56_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_138._72_8_;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = uVar307;
      auVar267 = auVar40 * auVar174 + auVar267;
      uVar307 = auVar267._0_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar307 & 0xfffffffffffff;
      auVar3 = auVar38 * auVar172 + auVar266 + auVar39 * auVar173 + auVar41 * ZEXT816(0x1000003d10);
      uVar311 = auVar3._0_8_;
      local_158 = uVar311 & 0xfffffffffffff;
      auVar268._8_8_ = 0;
      auVar268._0_8_ = (uVar311 >> 0x34 | auVar3._8_8_ << 0xc) + local_60.n[0];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar307 >> 0x34 | auVar267._8_8_ << 0xc;
      auVar268 = auVar42 * ZEXT816(0x1000003d10) + auVar268;
      uVar307 = auVar268._0_8_;
      uStack_150 = uVar307 & 0xfffffffffffff;
      local_148 = (secp256k1_context *)((uVar307 >> 0x34 | auVar268._8_8_ << 0xc) + local_138._0_8_)
      ;
      local_140 = 1;
      psStack_1c0 = (secp256k1_fe *)0x124a76;
      secp256k1_fe_verify(t);
      psStack_1c0 = (secp256k1_fe *)0x124a91;
      secp256k1_fe_mul(&local_60,t,(secp256k1_fe *)(local_138 + 0x30));
      psStack_1c0 = (secp256k1_fe *)0x124a99;
      secp256k1_fe_verify(&local_60);
      local_60.n[0] = local_60.n[0] + 7;
      local_60.magnitude = local_60.magnitude + 1;
      local_60.normalized = 0;
      psStack_1c0 = (secp256k1_fe *)0x124aaf;
      secp256k1_fe_verify(&local_60);
      local_138._40_8_ = CONCAT44(local_60.normalized,local_60.magnitude);
      local_138._32_8_ = local_60.n[4];
      local_138._16_8_ = local_60.n[2];
      local_138._24_8_ = local_60.n[3];
      local_138._0_8_ = local_60.n[0];
      local_138._8_8_ = local_60.n[1];
      psStack_1c0 = (secp256k1_fe *)0x124ad5;
      secp256k1_fe_verify((secp256k1_fe *)local_138);
      xn = (secp256k1_fe *)(local_138 + 0x60);
      psStack_1c0 = (secp256k1_fe *)0x124ae5;
      secp256k1_fe_verify(xn);
      if (0x20 < (int)uStack_b0 + local_138._40_4_) goto LAB_00125243;
      local_138._0_8_ = local_138._0_8_ + local_138._96_8_;
      local_138._8_8_ = local_138._8_8_ + local_138._104_8_;
      local_138._16_8_ = local_138._16_8_ + local_138._112_8_;
      local_138._24_8_ = local_138._24_8_ + local_138._120_8_;
      local_138._32_8_ = local_138._32_8_ + local_138._128_8_;
      local_138._44_4_ = 0;
      local_138._40_4_ = (int)uStack_b0 + local_138._40_4_;
      psStack_1c0 = (secp256k1_fe *)0x124b3f;
      secp256k1_fe_verify((secp256k1_fe *)local_138);
      psStack_1c0 = (secp256k1_fe *)0x124b47;
      secp256k1_fe_verify((secp256k1_fe *)local_138);
      p_Var309 = (_func_void_char_ptr_void_ptr *)
                 (local_138._0_8_ + ((ulong)local_138._32_8_ >> 0x30) * local_1a0);
      if ((((ulong)p_Var309 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (((ulong)p_Var309 & 0xfffffffffffff) == 0)) {
        uVar307 = ((ulong)p_Var309 >> 0x34) + local_138._8_8_;
        p_Var315 = (_func_void_char_ptr_void_ptr *)(local_138._16_8_ + (uVar307 >> 0x34));
        uVar311 = ((ulong)p_Var315 >> 0x34) + local_138._24_8_;
        uVar314 = (uVar311 >> 0x34) + (local_138._32_8_ & 0xffffffffffff);
        if ((((uVar307 | (ulong)p_Var309 | (ulong)p_Var315 | uVar311) & 0xfffffffffffff) == 0 &&
             uVar314 == 0) ||
           ((((ulong)p_Var309 | 0x1000003d0) & uVar307 & (ulong)p_Var315 & uVar311 &
            (uVar314 ^ 0xf000000000000)) == 0xfffffffffffff)) {
          psStack_1c0 = (secp256k1_fe *)0x1252dd;
          secp256k1_ellswift_xswiftec_frac_var_cold_1();
        }
      }
      psStack_1c0 = (secp256k1_fe *)0x124c2b;
      secp256k1_fe_mul(&local_a0,(secp256k1_fe *)(local_138 + 0x60),
                       (secp256k1_fe *)(local_198 + 0x30));
      psStack_1c0 = (secp256k1_fe *)0x124c33;
      secp256k1_fe_verify(&local_a0);
      if (10 < local_a0.magnitude) goto LAB_00125248;
      local_a0.magnitude = local_a0.magnitude * 3;
      local_a0.n[0] = local_a0.n[0] * 3;
      local_a0.n[1] = local_a0.n[1] * 3;
      local_a0.n[2] = local_a0.n[2] * 3;
      local_a0.n[3] = local_a0.n[3] * 3;
      local_a0.n[4] = local_a0.n[4] * 3;
      local_a0.normalized = 0;
      psStack_1c0 = (secp256k1_fe *)0x124c93;
      secp256k1_fe_verify(&local_a0);
      psStack_1c0 = (secp256k1_fe *)0x124ca3;
      secp256k1_fe_verify((secp256k1_fe *)local_138);
      uVar307 = local_138._24_8_;
      uVar305 = local_138._16_8_;
      if (8 < (int)local_138._40_4_) goto LAB_0012524d;
      t = (secp256k1_fe *)(local_198 + 0x30);
      xd = (secp256k1_fe *)0xfffffffffffff;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_138._0_8_ * 2;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_138._24_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_138._8_8_ * 2;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = local_138._16_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_138._32_8_;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = local_138._32_8_;
      uVar311 = SUB168(auVar45 * auVar177,0);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar311 & 0xfffffffffffff;
      auVar3 = auVar44 * auVar176 + auVar43 * auVar175 + auVar46 * ZEXT816(0x1000003d10);
      uVar314 = auVar3._0_8_;
      local_198._0_8_ = uVar314 & 0xfffffffffffff;
      auVar269._8_8_ = 0;
      auVar269._0_8_ = uVar314 >> 0x34 | auVar3._8_8_ << 0xc;
      xn = (secp256k1_fe *)(local_138._32_8_ * 2);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_138._0_8_;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = xn;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_138._8_8_ * 2;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_138._24_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_138._16_8_;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = local_138._16_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar311 >> 0x34 | SUB168(auVar45 * auVar177,8) << 0xc;
      auVar3 = auVar47 * auVar178 + auVar269 + auVar48 * auVar179 + auVar49 * auVar180 +
               auVar50 * ZEXT816(0x1000003d10);
      uVar311 = auVar3._0_8_;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      local_70 = (void *)((uVar311 & 0xfffffffffffff) >> 0x30);
      local_68 = (_func_void_char_ptr_void_ptr *)(uVar311 & 0xffffffffffff);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_138._0_8_;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = local_138._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_138._8_8_;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = xn;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_138._16_8_ * 2;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_138._24_8_;
      auVar3 = auVar52 * auVar182 + auVar270 + auVar53 * auVar183;
      uVar311 = auVar3._0_8_;
      auVar272._8_8_ = 0;
      auVar272._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = (uVar311 & 0xfffffffffffff) << 4 | (ulong)local_70;
      auVar3 = auVar51 * auVar181 + ZEXT816(0x1000003d1) * auVar184;
      uVar311 = auVar3._0_8_;
      local_198._48_8_ = uVar311 & 0xfffffffffffff;
      auVar271._8_8_ = 0;
      auVar271._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_138._0_8_ * 2;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_138._8_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_138._16_8_;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = xn;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_138._24_8_;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_138._24_8_;
      auVar4 = auVar55 * auVar186 + auVar272 + auVar56 * auVar187;
      uVar311 = auVar4._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar311 & 0xfffffffffffff;
      auVar3 = auVar54 * auVar185 + auVar271 + auVar57 * ZEXT816(0x1000003d10);
      uVar314 = auVar3._0_8_;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = uVar311 >> 0x34 | auVar4._8_8_ << 0xc;
      uStack_160 = uVar314 & 0xfffffffffffff;
      auVar273._8_8_ = 0;
      auVar273._0_8_ = uVar314 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_138._0_8_ * 2;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = local_138._16_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_138._8_8_;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = local_138._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_138._24_8_;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = xn;
      auVar274 = auVar60 * auVar190 + auVar274;
      uVar311 = auVar274._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar311 & 0xfffffffffffff;
      auVar3 = auVar58 * auVar188 + auVar273 + auVar59 * auVar189 + auVar61 * ZEXT816(0x1000003d10);
      uVar314 = auVar3._0_8_;
      local_158 = uVar314 & 0xfffffffffffff;
      auVar275._8_8_ = 0;
      auVar275._0_8_ = (uVar314 >> 0x34 | auVar3._8_8_ << 0xc) + local_198._0_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar311 >> 0x34 | auVar274._8_8_ << 0xc;
      auVar275 = auVar62 * ZEXT816(0x1000003d10) + auVar275;
      uVar311 = auVar275._0_8_;
      uStack_150 = uVar311 & 0xfffffffffffff;
      psVar319 = (secp256k1_context *)(local_68 + (uVar311 >> 0x34 | auVar275._8_8_ << 0xc));
      local_140 = 1;
      psStack_1c0 = (secp256k1_fe *)0x124ef6;
      local_148 = psVar319;
      secp256k1_fe_verify(t);
      psStack_1c0 = (secp256k1_fe *)0x124efe;
      secp256k1_fe_verify(t);
      if (1 < (int)local_140) goto LAB_00125252;
      local_198._48_8_ = 0x3ffffbfffff0bc - local_198._48_8_;
      uStack_160 = 0x3ffffffffffffc - uStack_160;
      local_158 = 0x3ffffffffffffc - local_158;
      uStack_150 = 0x3ffffffffffffc - uStack_150;
      local_148 = (secp256k1_context *)(0x3fffffffffffc - (long)local_148);
      local_140 = 2;
      psStack_1c0 = (secp256k1_fe *)0x124f51;
      secp256k1_fe_verify((secp256k1_fe *)(local_198 + 0x30));
      xn = (secp256k1_fe *)local_198;
      psStack_1c0 = (secp256k1_fe *)0x124f6e;
      secp256k1_fe_mul(xn,&local_a0,(secp256k1_fe *)(local_138 + 0x30));
      psStack_1c0 = (secp256k1_fe *)0x124f76;
      secp256k1_fe_verify(xn);
      psStack_1c0 = (secp256k1_fe *)0x124f7e;
      secp256k1_fe_verify((secp256k1_fe *)(local_198 + 0x30));
      if ((int)local_140 + local_198._40_4_ < 0x21) {
        local_198._0_8_ = local_198._0_8_ + local_198._48_8_;
        local_198._8_8_ = local_198._8_8_ + uStack_160;
        local_198._16_8_ = local_198._16_8_ + local_158;
        local_198._24_8_ = local_198._24_8_ + uStack_150;
        local_198._32_8_ = local_198._32_8_ + (long)local_148;
        local_198._44_4_ = 0;
        psStack_1c0 = (secp256k1_fe *)0x124fcc;
        psVar322 = local_148;
        local_198._40_4_ = (int)local_140 + local_198._40_4_;
        secp256k1_fe_verify((secp256k1_fe *)local_198);
        psStack_1c0 = (secp256k1_fe *)0x124fdc;
        iVar306 = secp256k1_ge_x_frac_on_curve_var((secp256k1_fe *)local_198,&local_a0);
        if (iVar306 != 0) {
          local_1b0->n[4] = local_198._32_8_;
          local_1b0->magnitude = local_198._40_4_;
          local_1b0->normalized = local_198._44_4_;
          local_1b0->n[2] = local_198._16_8_;
          local_1b0->n[3] = local_198._24_8_;
          local_1b0->n[0] = local_198._0_8_;
          local_1b0->n[1] = local_198._8_8_;
          local_198._36_4_ = local_a0.n[4]._4_4_;
          local_198._40_4_ = local_a0.magnitude;
          local_198._44_4_ = local_a0.normalized;
          local_198._0_8_ = local_a0.n[0];
          local_198._8_8_ = local_a0.n[1];
          local_198._16_8_ = local_a0.n[2];
          local_198._24_8_ = local_a0.n[3];
LAB_0012511e:
          *(int *)(local_1a8->n + 4) = (int)local_a0.n[4];
          *(undefined4 *)((long)local_1a8->n + 0x24) = local_198._36_4_;
          local_1a8->magnitude = local_198._40_4_;
          local_1a8->normalized = local_198._44_4_;
          local_1a8->n[2] = local_198._16_8_;
          local_1a8->n[3] = local_198._24_8_;
          local_1a8->n[0] = local_198._0_8_;
          local_1a8->n[1] = local_198._8_8_;
          return;
        }
        local_1a8->n[4] = local_138._32_8_;
        local_1a8->magnitude = local_138._40_4_;
        local_1a8->normalized = local_138._44_4_;
        local_1a8->n[2] = local_138._16_8_;
        local_1a8->n[3] = local_138._24_8_;
        local_1a8->n[0] = local_138._0_8_;
        local_1a8->n[1] = local_138._8_8_;
        r = (secp256k1_context *)(local_198 + 0x30);
        psStack_1c0 = (secp256k1_fe *)0x125067;
        secp256k1_fe_mul((secp256k1_fe *)r,&secp256k1_ellswift_c1,(secp256k1_fe *)(local_138 + 0x60)
                        );
        psVar316 = &secp256k1_ellswift_c2;
        psStack_1c0 = (secp256k1_fe *)0x125083;
        secp256k1_fe_mul((secp256k1_fe *)local_198,&secp256k1_ellswift_c2,&local_60);
        psStack_1c0 = (secp256k1_fe *)0x12508b;
        secp256k1_fe_verify((secp256k1_fe *)local_198);
        psStack_1c0 = (secp256k1_fe *)0x125093;
        secp256k1_fe_verify((secp256k1_fe *)r);
        if ((int)local_140 + local_198._40_4_ < 0x21) {
          local_198._0_8_ = local_198._0_8_ + local_198._48_8_;
          local_198._8_8_ = local_198._8_8_ + uStack_160;
          local_198._16_8_ = local_198._16_8_ + local_158;
          local_198._24_8_ = local_198._24_8_ + uStack_150;
          local_198._32_8_ = local_198._32_8_ + (long)local_148;
          local_198._44_4_ = 0;
          psStack_1c0 = (secp256k1_fe *)0x1250e1;
          psVar322 = local_148;
          local_198._40_4_ = (int)local_140 + local_198._40_4_;
          secp256k1_fe_verify((secp256k1_fe *)local_198);
          psStack_1c0 = (secp256k1_fe *)0x1250f4;
          secp256k1_fe_mul((secp256k1_fe *)local_198,(secp256k1_fe *)local_198,
                           (secp256k1_fe *)(local_138 + 0x30));
          psStack_1c0 = (secp256k1_fe *)0x125104;
          iVar306 = secp256k1_ge_x_frac_on_curve_var
                              ((secp256k1_fe *)local_198,(secp256k1_fe *)local_138);
          if (iVar306 != 0) {
            local_1a8 = local_1b0;
            local_a0.n[4]._0_4_ = local_198._32_4_;
            goto LAB_0012511e;
          }
          r = (secp256k1_context *)(local_198 + 0x30);
          psVar316 = (secp256k1_fe *)local_138;
          psStack_1c0 = (secp256k1_fe *)0x12515a;
          secp256k1_fe_mul((secp256k1_fe *)r,psVar316,(secp256k1_fe *)(local_138 + 0x30));
          xn = (secp256k1_fe *)local_198;
          psStack_1c0 = (secp256k1_fe *)0x125167;
          secp256k1_fe_verify(xn);
          psStack_1c0 = (secp256k1_fe *)0x12516f;
          secp256k1_fe_verify((secp256k1_fe *)r);
          if (0x20 < (int)local_140 + local_198._40_4_) goto LAB_001252e7;
          r = (secp256k1_context *)local_198;
          local_198._0_8_ = local_198._0_8_ + local_198._48_8_;
          local_198._8_8_ = local_198._8_8_ + uStack_160;
          local_198._16_8_ = local_198._16_8_ + local_158;
          local_198._24_8_ = local_198._24_8_ + uStack_150;
          local_198._32_8_ = local_198._32_8_ + (long)local_148;
          local_198._44_4_ = 0;
          psStack_1c0 = (secp256k1_fe *)0x1251bd;
          psVar322 = local_148;
          local_198._40_4_ = (int)local_140 + local_198._40_4_;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psStack_1c0 = (secp256k1_fe *)0x1251c5;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psVar313 = local_1b0;
          if ((int)local_198._40_4_ < 3) {
            local_1b0->n[0] = 0x5ffff9ffffe91a - local_198._0_8_;
            local_1b0->n[1] = 0x5ffffffffffffa - local_198._8_8_;
            local_1b0->n[2] = 0x5ffffffffffffa - local_198._16_8_;
            local_1b0->n[3] = 0x5ffffffffffffa - local_198._24_8_;
            local_1b0->n[4] = 0x5fffffffffffa - local_198._32_8_;
            local_1b0->magnitude = 3;
            local_1b0->normalized = 0;
            psStack_1c0 = (secp256k1_fe *)0x12521c;
            secp256k1_fe_verify(local_1b0);
            psStack_1c0 = (secp256k1_fe *)0x12522c;
            iVar306 = secp256k1_ge_x_frac_on_curve_var(psVar313,(secp256k1_fe *)local_138);
            if (iVar306 != 0) {
              return;
            }
            psStack_1c0 = (secp256k1_fe *)0x125239;
            secp256k1_ellswift_xswiftec_frac_var_cold_2();
            goto LAB_00125239;
          }
        }
        else {
          psStack_1c0 = (secp256k1_fe *)0x1252e7;
          secp256k1_ellswift_xswiftec_frac_var_cold_5();
LAB_001252e7:
          psVar313 = (secp256k1_fe *)(local_198 + 0x30);
          psStack_1c0 = (secp256k1_fe *)0x1252ec;
          secp256k1_ellswift_xswiftec_frac_var_cold_4();
        }
        psStack_1c0 = (secp256k1_fe *)secp256k1_ecmult_const_xonly;
        secp256k1_ellswift_xswiftec_frac_var_cold_3();
        pvStack_1c8 = (void *)0xfffffffffffff;
        uStack_1d8 = uVar307;
        p_Stack_1e0 = (_func_void_char_ptr_void_ptr *)uVar305;
        a_00 = (secp256k1_context *)((ulong)psVar319 & 0xffffffff);
        psStack_398 = (secp256k1_context *)0x125319;
        psVar310 = psVar322;
        a_01 = (secp256k1_context *)psVar316;
        ctx = (secp256k1_context *)psVar316;
        psStack_1e8 = psVar313;
        p_Stack_1d0 = (_func_void_char_ptr_void_ptr *)local_198;
        psStack_1c0 = t;
        secp256k1_fe_verify(psVar316);
        if ((int)(((secp256k1_context *)psVar316)->ecmult_gen_ctx).initial.x.n[0] < 9) {
          iStack_38c = (int)psVar319;
          a_00 = (secp256k1_context *)auStack_360;
          uVar311 = *(ulong *)&((secp256k1_context *)psVar316)->ecmult_gen_ctx;
          uVar314 = (((secp256k1_context *)psVar316)->ecmult_gen_ctx).blind.d[0];
          psVar319 = (secp256k1_context *)
                     (((secp256k1_context *)psVar316)->ecmult_gen_ctx).blind.d[1];
          uVar307 = (((secp256k1_context *)psVar316)->ecmult_gen_ctx).blind.d[2];
          uVar317 = (((secp256k1_context *)psVar316)->ecmult_gen_ctx).blind.d[3];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar311 * 2;
          auVar191._8_8_ = 0;
          auVar191._0_8_ = uVar307;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar314 * 2;
          auVar192._8_8_ = 0;
          auVar192._0_8_ = psVar319;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar317;
          auVar193._8_8_ = 0;
          auVar193._0_8_ = uVar317;
          uVar318 = SUB168(auVar65 * auVar193,0);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar318 & 0xfffffffffffff;
          auVar3 = auVar64 * auVar192 + auVar63 * auVar191 + auVar66 * ZEXT816(0x1000003d10);
          uVar308 = auVar3._0_8_;
          auStack_360._112_8_ = uVar308 & 0xfffffffffffff;
          auVar276._8_8_ = 0;
          auVar276._0_8_ = uVar308 >> 0x34 | auVar3._8_8_ << 0xc;
          b = (secp256k1_context *)(uVar317 * 2);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar311;
          auVar194._8_8_ = 0;
          auVar194._0_8_ = b;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar314 * 2;
          auVar195._8_8_ = 0;
          auVar195._0_8_ = uVar307;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = psVar319;
          auVar196._8_8_ = 0;
          auVar196._0_8_ = psVar319;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar318 >> 0x34 | SUB168(auVar65 * auVar193,8) << 0xc;
          auVar3 = auVar67 * auVar194 + auVar276 + auVar68 * auVar195 + auVar69 * auVar196 +
                   auVar70 * ZEXT816(0x1000003d10);
          auStack_250._0_8_ = auVar3._0_8_;
          auVar277._8_8_ = 0;
          auVar277._0_8_ = (ulong)auStack_250._0_8_ >> 0x34 | auVar3._8_8_ << 0xc;
          auStack_360._48_8_ = (auStack_250._0_8_ & 0xfffffffffffff) >> 0x30;
          auStack_250._0_8_ = auStack_250._0_8_ & 0xffffffffffff;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar311;
          auVar197._8_8_ = 0;
          auVar197._0_8_ = uVar311;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uVar314;
          auVar198._8_8_ = 0;
          auVar198._0_8_ = b;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = (long)psVar319 * 2;
          auVar199._8_8_ = 0;
          auVar199._0_8_ = uVar307;
          auVar3 = auVar72 * auVar198 + auVar277 + auVar73 * auVar199;
          uVar317 = auVar3._0_8_;
          auVar279._8_8_ = 0;
          auVar279._0_8_ = uVar317 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar200._8_8_ = 0;
          auVar200._0_8_ = (uVar317 & 0xfffffffffffff) << 4 | auStack_360._48_8_;
          auVar3 = auVar71 * auVar197 + ZEXT816(0x1000003d1) * auVar200;
          uVar317 = auVar3._0_8_;
          auStack_360._0_8_ = uVar317 & 0xfffffffffffff;
          auVar278._8_8_ = 0;
          auVar278._0_8_ = uVar317 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = uVar311 * 2;
          auVar201._8_8_ = 0;
          auVar201._0_8_ = uVar314;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = psVar319;
          auVar202._8_8_ = 0;
          auVar202._0_8_ = b;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar307;
          auVar203._8_8_ = 0;
          auVar203._0_8_ = uVar307;
          auVar4 = auVar75 * auVar202 + auVar279 + auVar76 * auVar203;
          uVar317 = auVar4._0_8_;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar317 & 0xfffffffffffff;
          auVar3 = auVar74 * auVar201 + auVar278 + auVar77 * ZEXT816(0x1000003d10);
          uVar318 = auVar3._0_8_;
          auVar281._8_8_ = 0;
          auVar281._0_8_ = uVar317 >> 0x34 | auVar4._8_8_ << 0xc;
          auStack_360._8_8_ = uVar318 & 0xfffffffffffff;
          auVar280._8_8_ = 0;
          auVar280._0_8_ = uVar318 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar311 * 2;
          auVar204._8_8_ = 0;
          auVar204._0_8_ = psVar319;
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar314;
          auVar205._8_8_ = 0;
          auVar205._0_8_ = uVar314;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar307;
          auVar206._8_8_ = 0;
          auVar206._0_8_ = b;
          auVar281 = auVar80 * auVar206 + auVar281;
          uVar311 = auVar281._0_8_;
          psVar310 = auVar281._8_8_;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar311 & 0xfffffffffffff;
          auVar3 = auVar78 * auVar204 + auVar280 + auVar79 * auVar205 +
                   auVar81 * ZEXT816(0x1000003d10);
          uVar314 = auVar3._0_8_;
          auStack_360._16_8_ = uVar314 & 0xfffffffffffff;
          auVar282._8_8_ = 0;
          auVar282._0_8_ = (uVar314 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_360._112_8_;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar311 >> 0x34 | (long)psVar310 << 0xc;
          auVar282 = auVar82 * ZEXT816(0x1000003d10) + auVar282;
          uVar311 = auVar282._0_8_;
          auStack_360._24_8_ = uVar311 & 0xfffffffffffff;
          auStack_360._32_8_ = (uVar311 >> 0x34 | auVar282._8_8_ << 0xc) + auStack_250._0_8_;
          auStack_360._40_8_ = 1;
          psStack_398 = (secp256k1_context *)0x125590;
          psStack_388 = a;
          psStack_380 = (secp256k1_context *)psVar316;
          psStack_370 = r;
          psStack_368 = psVar322;
          secp256k1_fe_verify((secp256k1_fe *)a_00);
          psStack_398 = (secp256k1_context *)0x12559e;
          secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,psVar316);
          if (a == (secp256k1_context *)0x0) {
            psStack_398 = (secp256k1_context *)0x1259ec;
            secp256k1_fe_verify((secp256k1_fe *)auStack_360);
            auStack_360._0_8_ = auStack_360._0_8_ + 7;
            auStack_360._44_4_ = 0;
            auStack_360._40_4_ = auStack_360._40_4_ + 1;
            psStack_398 = (secp256k1_context *)0x125a02;
            secp256k1_fe_verify((secp256k1_fe *)auStack_360);
            if (iStack_38c == 0) {
              psVar313 = (secp256k1_fe *)auStack_360;
LAB_00125a0e:
              psStack_398 = (secp256k1_context *)0x125a13;
              iVar306 = secp256k1_fe_is_square_var(psVar313);
              if (iVar306 == 0) {
                return;
              }
            }
LAB_00125a1b:
            r = (secp256k1_context *)auStack_360;
            psStack_398 = (secp256k1_context *)0x125a33;
            a_01 = r;
            secp256k1_fe_mul((secp256k1_fe *)auStack_250,(secp256k1_fe *)r,psVar316);
            psStack_398 = (secp256k1_context *)0x125a3b;
            ctx = r;
            secp256k1_fe_verify((secp256k1_fe *)r);
            uVar311 = auStack_360._24_8_;
            psVar321 = (secp256k1_context *)auStack_360._16_8_;
            psVar322 = (secp256k1_context *)psVar316;
            if (8 < (int)auStack_360._40_4_) goto LAB_00125fb4;
            a_00 = (secp256k1_context *)(auStack_250 + 0x30);
            psVar322 = (secp256k1_context *)0xfffffffffffff;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = auStack_360._0_8_ * 2;
            auVar223._8_8_ = 0;
            auVar223._0_8_ = auStack_360._24_8_;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = auStack_360._8_8_ * 2;
            auVar224._8_8_ = 0;
            auVar224._0_8_ = auStack_360._16_8_;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = auStack_360._32_8_;
            auVar225._8_8_ = 0;
            auVar225._0_8_ = auStack_360._32_8_;
            uVar307 = SUB168(auVar105 * auVar225,0);
            auVar106._8_8_ = 0;
            auVar106._0_8_ = uVar307 & 0xfffffffffffff;
            auVar3 = auVar104 * auVar224 + auVar103 * auVar223 + auVar106 * ZEXT816(0x1000003d10);
            uVar314 = auVar3._0_8_;
            auStack_360._112_8_ = uVar314 & 0xfffffffffffff;
            auVar290._8_8_ = 0;
            auVar290._0_8_ = uVar314 >> 0x34 | auVar3._8_8_ << 0xc;
            b = (secp256k1_context *)(auStack_360._32_8_ * 2);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = auStack_360._0_8_;
            auVar226._8_8_ = 0;
            auVar226._0_8_ = b;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = auStack_360._8_8_ * 2;
            auVar227._8_8_ = 0;
            auVar227._0_8_ = auStack_360._24_8_;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auStack_360._16_8_;
            auVar228._8_8_ = 0;
            auVar228._0_8_ = auStack_360._16_8_;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = uVar307 >> 0x34 | SUB168(auVar105 * auVar225,8) << 0xc;
            auVar3 = auVar107 * auVar226 + auVar290 + auVar108 * auVar227 + auVar109 * auVar228 +
                     auVar110 * ZEXT816(0x1000003d10);
            uVar307 = auVar3._0_8_;
            auVar291._8_8_ = 0;
            auVar291._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
            uStack_378 = (uVar307 & 0xfffffffffffff) >> 0x30;
            a_01 = (secp256k1_context *)(uVar307 & 0xffffffffffff);
            auVar111._8_8_ = 0;
            auVar111._0_8_ = auStack_360._0_8_;
            auVar229._8_8_ = 0;
            auVar229._0_8_ = auStack_360._0_8_;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = auStack_360._8_8_;
            auVar230._8_8_ = 0;
            auVar230._0_8_ = b;
            auVar113._8_8_ = 0;
            auVar113._0_8_ = auStack_360._16_8_ * 2;
            auVar231._8_8_ = 0;
            auVar231._0_8_ = auStack_360._24_8_;
            auVar3 = auVar112 * auVar230 + auVar291 + auVar113 * auVar231;
            uVar307 = auVar3._0_8_;
            auVar293._8_8_ = 0;
            auVar293._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
            auVar232._8_8_ = 0;
            auVar232._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | uStack_378;
            auVar3 = auVar111 * auVar229 + ZEXT816(0x1000003d1) * auVar232;
            uVar307 = auVar3._0_8_;
            auStack_250._48_8_ = uVar307 & 0xfffffffffffff;
            auVar292._8_8_ = 0;
            auVar292._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = auStack_360._0_8_ * 2;
            auVar233._8_8_ = 0;
            auVar233._0_8_ = auStack_360._8_8_;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = auStack_360._16_8_;
            auVar234._8_8_ = 0;
            auVar234._0_8_ = b;
            auVar116._8_8_ = 0;
            auVar116._0_8_ = auStack_360._24_8_;
            auVar235._8_8_ = 0;
            auVar235._0_8_ = auStack_360._24_8_;
            auVar4 = auVar115 * auVar234 + auVar293 + auVar116 * auVar235;
            uVar307 = auVar4._0_8_;
            auVar117._8_8_ = 0;
            auVar117._0_8_ = uVar307 & 0xfffffffffffff;
            auVar3 = auVar114 * auVar233 + auVar292 + auVar117 * ZEXT816(0x1000003d10);
            uVar314 = auVar3._0_8_;
            auVar295._8_8_ = 0;
            auVar295._0_8_ = uVar307 >> 0x34 | auVar4._8_8_ << 0xc;
            uStack_218 = uVar314 & 0xfffffffffffff;
            auVar294._8_8_ = 0;
            auVar294._0_8_ = uVar314 >> 0x34 | auVar3._8_8_ << 0xc;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = auStack_360._0_8_ * 2;
            auVar236._8_8_ = 0;
            auVar236._0_8_ = auStack_360._16_8_;
            auVar119._8_8_ = 0;
            auVar119._0_8_ = auStack_360._8_8_;
            auVar237._8_8_ = 0;
            auVar237._0_8_ = auStack_360._8_8_;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = auStack_360._24_8_;
            auVar238._8_8_ = 0;
            auVar238._0_8_ = b;
            auVar295 = auVar120 * auVar238 + auVar295;
            uVar307 = auVar295._0_8_;
            psVar310 = auVar295._8_8_;
            auVar121._8_8_ = 0;
            auVar121._0_8_ = uVar307 & 0xfffffffffffff;
            auVar3 = auVar118 * auVar236 + auVar294 + auVar119 * auVar237 +
                     auVar121 * ZEXT816(0x1000003d10);
            uVar314 = auVar3._0_8_;
            r = (secp256k1_context *)(uVar307 >> 0x34 | (long)psVar310 << 0xc);
            uStack_210 = uVar314 & 0xfffffffffffff;
            auVar296._8_8_ = 0;
            auVar296._0_8_ = (uVar314 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_360._112_8_;
            auVar122._8_8_ = 0;
            auVar122._0_8_ = r;
            auVar296 = auVar122 * ZEXT816(0x1000003d10) + auVar296;
            uVar307 = auVar296._0_8_;
            uStack_208 = uVar307 & 0xfffffffffffff;
            puStack_200 = (undefined1 *)
                          ((long)(a_01->ecmult_gen_ctx).blind.d +
                          ((uVar307 >> 0x34 | auVar296._8_8_ << 0xc) - 8));
            uStack_1f8 = 1;
            psStack_398 = (secp256k1_context *)0x125c8b;
            ctx = a_00;
            auStack_360._48_8_ = a_01;
            secp256k1_fe_verify((secp256k1_fe *)a_00);
            uStack_1f0 = 0;
            auVar324._0_4_ =
                 -(uint)((int)(psStack_368->ecmult_gen_ctx).blind.d[1] == 0 &&
                        (int)*(uint64_t *)&(psStack_368->ecmult_gen_ctx).built == 0);
            auVar324._4_4_ =
                 -(uint)(*(int *)((long)(psStack_368->ecmult_gen_ctx).blind.d + 0xc) == 0 &&
                        *(int *)&(psStack_368->ecmult_gen_ctx).field_0x4 == 0);
            auVar324._8_4_ =
                 -(uint)((int)(psStack_368->ecmult_gen_ctx).blind.d[2] == 0 &&
                        (int)(psStack_368->ecmult_gen_ctx).blind.d[0] == 0);
            auVar324._12_4_ =
                 -(uint)(*(int *)((long)(psStack_368->ecmult_gen_ctx).blind.d + 0x14) == 0 &&
                        *(int *)((long)(psStack_368->ecmult_gen_ctx).blind.d + 4) == 0);
            iVar306 = movmskps(extraout_EAX,auVar324);
            if (iVar306 == 0xf) goto LAB_00125fb9;
            r = (secp256k1_context *)(auStack_360 + 0x70);
            a_01 = (secp256k1_context *)auStack_250;
            psStack_398 = (secp256k1_context *)0x125cd0;
            secp256k1_ecmult_const
                      ((secp256k1_gej *)r,(secp256k1_ge *)a_01,(secp256k1_scalar *)psStack_368);
            psStack_398 = (secp256k1_context *)0x125cd8;
            ctx = r;
            secp256k1_gej_verify((secp256k1_gej *)r);
            if (iStack_260 != 0) goto LAB_00125fbe;
            r = (secp256k1_context *)&p_Stack_290;
            psStack_398 = (secp256k1_context *)0x125cf5;
            ctx = r;
            secp256k1_fe_verify((secp256k1_fe *)r);
            if (iStack_268 < 9) {
              psVar316 = (secp256k1_fe *)(auStack_360 + 0x30);
              auVar123._8_8_ = 0;
              auVar123._0_8_ = (long)p_Stack_290 * 2;
              auVar239._8_8_ = 0;
              auVar239._0_8_ = uStack_278;
              auVar124._8_8_ = 0;
              auVar124._0_8_ = (long)pvStack_288 * 2;
              auVar240._8_8_ = 0;
              auVar240._0_8_ = uStack_280;
              auVar125._8_8_ = 0;
              auVar125._0_8_ = uStack_270;
              auVar241._8_8_ = 0;
              auVar241._0_8_ = uStack_270;
              uVar307 = SUB168(auVar125 * auVar241,0);
              auVar126._8_8_ = 0;
              auVar126._0_8_ = uVar307 & 0xfffffffffffff;
              auVar3 = auVar124 * auVar240 + auVar123 * auVar239 + auVar126 * ZEXT816(0x1000003d10);
              uVar311 = auVar3._0_8_;
              uStack_378 = uVar311 & 0xfffffffffffff;
              auVar297._8_8_ = 0;
              auVar297._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
              uStack_270 = uStack_270 * 2;
              auVar127._8_8_ = 0;
              auVar127._0_8_ = p_Stack_290;
              auVar242._8_8_ = 0;
              auVar242._0_8_ = uStack_270;
              auVar128._8_8_ = 0;
              auVar128._0_8_ = (long)pvStack_288 * 2;
              auVar243._8_8_ = 0;
              auVar243._0_8_ = uStack_278;
              auVar129._8_8_ = 0;
              auVar129._0_8_ = uStack_280;
              auVar244._8_8_ = 0;
              auVar244._0_8_ = uStack_280;
              auVar130._8_8_ = 0;
              auVar130._0_8_ = uVar307 >> 0x34 | SUB168(auVar125 * auVar241,8) << 0xc;
              auVar3 = auVar127 * auVar242 + auVar297 + auVar128 * auVar243 + auVar129 * auVar244 +
                       auVar130 * ZEXT816(0x1000003d10);
              auStack_360._104_8_ = auVar3._0_8_;
              auVar298._8_8_ = 0;
              auVar298._0_8_ = (ulong)auStack_360._104_8_ >> 0x34 | auVar3._8_8_ << 0xc;
              auStack_360._96_8_ = (auStack_360._104_8_ & 0xfffffffffffff) >> 0x30;
              auStack_360._104_8_ = auStack_360._104_8_ & 0xffffffffffff;
              auVar131._8_8_ = 0;
              auVar131._0_8_ = p_Stack_290;
              auVar245._8_8_ = 0;
              auVar245._0_8_ = p_Stack_290;
              auVar132._8_8_ = 0;
              auVar132._0_8_ = pvStack_288;
              auVar246._8_8_ = 0;
              auVar246._0_8_ = uStack_270;
              auVar133._8_8_ = 0;
              auVar133._0_8_ = uStack_280 * 2;
              auVar247._8_8_ = 0;
              auVar247._0_8_ = uStack_278;
              auVar3 = auVar132 * auVar246 + auVar298 + auVar133 * auVar247;
              uVar307 = auVar3._0_8_;
              auVar300._8_8_ = 0;
              auVar300._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
              auVar248._8_8_ = 0;
              auVar248._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | auStack_360._96_8_;
              auVar3 = auVar131 * auVar245 + ZEXT816(0x1000003d1) * auVar248;
              uVar307 = auVar3._0_8_;
              auStack_360._48_8_ = uVar307 & 0xfffffffffffff;
              auVar299._8_8_ = 0;
              auVar299._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
              auVar134._8_8_ = 0;
              auVar134._0_8_ = (long)p_Stack_290 * 2;
              auVar249._8_8_ = 0;
              auVar249._0_8_ = pvStack_288;
              auVar135._8_8_ = 0;
              auVar135._0_8_ = uStack_280;
              auVar250._8_8_ = 0;
              auVar250._0_8_ = uStack_270;
              auVar136._8_8_ = 0;
              auVar136._0_8_ = uStack_278;
              auVar251._8_8_ = 0;
              auVar251._0_8_ = uStack_278;
              auVar4 = auVar135 * auVar250 + auVar300 + auVar136 * auVar251;
              uVar307 = auVar4._0_8_;
              auVar137._8_8_ = 0;
              auVar137._0_8_ = uVar307 & 0xfffffffffffff;
              auVar3 = auVar134 * auVar249 + auVar299 + auVar137 * ZEXT816(0x1000003d10);
              uVar311 = auVar3._0_8_;
              auVar302._8_8_ = 0;
              auVar302._0_8_ = uVar307 >> 0x34 | auVar4._8_8_ << 0xc;
              auStack_360._56_8_ = uVar311 & 0xfffffffffffff;
              auVar301._8_8_ = 0;
              auVar301._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
              auVar138._8_8_ = 0;
              auVar138._0_8_ = (long)p_Stack_290 * 2;
              auVar252._8_8_ = 0;
              auVar252._0_8_ = uStack_280;
              auVar139._8_8_ = 0;
              auVar139._0_8_ = pvStack_288;
              auVar253._8_8_ = 0;
              auVar253._0_8_ = pvStack_288;
              auVar140._8_8_ = 0;
              auVar140._0_8_ = uStack_278;
              auVar254._8_8_ = 0;
              auVar254._0_8_ = uStack_270;
              auVar302 = auVar140 * auVar254 + auVar302;
              uVar307 = auVar302._0_8_;
              auVar141._8_8_ = 0;
              auVar141._0_8_ = uVar307 & 0xfffffffffffff;
              auVar3 = auVar138 * auVar252 + auVar301 + auVar139 * auVar253 +
                       auVar141 * ZEXT816(0x1000003d10);
              uVar311 = auVar3._0_8_;
              auStack_360._64_8_ = uVar311 & 0xfffffffffffff;
              auVar303._8_8_ = 0;
              auVar303._0_8_ = (uVar311 >> 0x34 | auVar3._8_8_ << 0xc) + uStack_378;
              auVar142._8_8_ = 0;
              auVar142._0_8_ = uVar307 >> 0x34 | auVar302._8_8_ << 0xc;
              auVar303 = auVar142 * ZEXT816(0x1000003d10) + auVar303;
              uVar307 = auVar303._0_8_;
              auStack_360._72_8_ = uVar307 & 0xfffffffffffff;
              auStack_360._80_8_ = (uVar307 >> 0x34 | auVar303._8_8_ << 0xc) + auStack_360._104_8_;
              auStack_360._88_8_ = 1;
              psStack_398 = (secp256k1_context *)0x125f48;
              secp256k1_fe_verify(psVar316);
              psStack_398 = (secp256k1_context *)0x125f58;
              secp256k1_fe_mul(psVar316,psVar316,(secp256k1_fe *)auStack_360);
              if (psStack_388 != (secp256k1_context *)0x0) {
                psStack_398 = (secp256k1_context *)0x125f6f;
                secp256k1_fe_mul((secp256k1_fe *)(auStack_360 + 0x30),
                                 (secp256k1_fe *)(auStack_360 + 0x30),(secp256k1_fe *)psStack_388);
              }
              psVar316 = (secp256k1_fe *)(auStack_360 + 0x30);
              psStack_398 = (secp256k1_context *)0x125f7f;
              secp256k1_fe_inv(psVar316,psVar316);
              psStack_398 = (secp256k1_context *)0x125f94;
              secp256k1_fe_mul((secp256k1_fe *)psStack_370,(secp256k1_fe *)(auStack_360 + 0x70),
                               psVar316);
              return;
            }
            goto LAB_00125fc3;
          }
          psStack_398 = (secp256k1_context *)0x1255af;
          secp256k1_fe_verify((secp256k1_fe *)a);
          uVar311 = (a->ecmult_gen_ctx).blind.d[3];
          psVar310 = (secp256k1_context *)0x1000003d0;
          uVar314 = (uVar311 >> 0x30) * 0x1000003d1 + *(long *)&a->ecmult_gen_ctx;
          uVar317 = (uVar314 >> 0x34) + (a->ecmult_gen_ctx).blind.d[0];
          a_01 = (secp256k1_context *)((uVar317 >> 0x34) + (a->ecmult_gen_ctx).blind.d[1]);
          ctx = (secp256k1_context *)(((ulong)a_01 >> 0x34) + (a->ecmult_gen_ctx).blind.d[2]);
          uVar318 = ((ulong)ctx >> 0x34) + (uVar311 & 0xffffffffffff);
          r = a;
          psVar321 = psVar319;
          uVar311 = uVar307;
          psVar322 = (secp256k1_context *)psVar316;
          if ((((uVar317 | uVar314 | (ulong)a_01 | (ulong)ctx) & 0xfffffffffffff) == 0 &&
               uVar318 == 0) ||
             (((uVar314 ^ 0x1000003d0) & uVar317 & (ulong)a_01 & (ulong)ctx &
              (uVar318 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00125fc8;
          psStack_398 = (secp256k1_context *)0x125653;
          ctx = a;
          secp256k1_fe_verify((secp256k1_fe *)a);
          if (8 < (int)(a->ecmult_gen_ctx).initial.x.n[0]) goto LAB_00125fcd;
          a_00 = (secp256k1_context *)(auStack_360 + 0x70);
          uVar311 = *(ulong *)&a->ecmult_gen_ctx;
          uVar314 = (a->ecmult_gen_ctx).blind.d[0];
          psVar319 = (secp256k1_context *)(a->ecmult_gen_ctx).blind.d[1];
          uVar307 = (a->ecmult_gen_ctx).blind.d[2];
          uVar317 = (a->ecmult_gen_ctx).blind.d[3];
          psVar322 = (secp256k1_context *)0xfffffffffffff;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar311 * 2;
          auVar207._8_8_ = 0;
          auVar207._0_8_ = uVar307;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar314 * 2;
          auVar208._8_8_ = 0;
          auVar208._0_8_ = psVar319;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar317;
          auVar209._8_8_ = 0;
          auVar209._0_8_ = uVar317;
          uVar318 = SUB168(auVar85 * auVar209,0);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar318 & 0xfffffffffffff;
          auVar3 = auVar84 * auVar208 + auVar83 * auVar207 + auVar86 * ZEXT816(0x1000003d10);
          uVar308 = auVar3._0_8_;
          auStack_250._0_8_ = uVar308 & 0xfffffffffffff;
          auVar283._8_8_ = 0;
          auVar283._0_8_ = uVar308 >> 0x34 | auVar3._8_8_ << 0xc;
          b = (secp256k1_context *)(uVar317 * 2);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar311;
          auVar210._8_8_ = 0;
          auVar210._0_8_ = b;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar314 * 2;
          auVar211._8_8_ = 0;
          auVar211._0_8_ = uVar307;
          auVar89._8_8_ = 0;
          auVar89._0_8_ = psVar319;
          auVar212._8_8_ = 0;
          auVar212._0_8_ = psVar319;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar318 >> 0x34 | SUB168(auVar85 * auVar209,8) << 0xc;
          auVar3 = auVar87 * auVar210 + auVar283 + auVar88 * auVar211 + auVar89 * auVar212 +
                   auVar90 * ZEXT816(0x1000003d10);
          uVar317 = auVar3._0_8_;
          auVar284._8_8_ = 0;
          auVar284._0_8_ = uVar317 >> 0x34 | auVar3._8_8_ << 0xc;
          uStack_378 = (uVar317 & 0xfffffffffffff) >> 0x30;
          a_01 = (secp256k1_context *)(uVar317 & 0xffffffffffff);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar311;
          auVar213._8_8_ = 0;
          auVar213._0_8_ = uVar311;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar314;
          auVar214._8_8_ = 0;
          auVar214._0_8_ = b;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = (long)psVar319 * 2;
          auVar215._8_8_ = 0;
          auVar215._0_8_ = uVar307;
          auVar3 = auVar92 * auVar214 + auVar284 + auVar93 * auVar215;
          uVar317 = auVar3._0_8_;
          auVar286._8_8_ = 0;
          auVar286._0_8_ = uVar317 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar216._8_8_ = 0;
          auVar216._0_8_ = (uVar317 & 0xfffffffffffff) << 4 | uStack_378;
          auVar3 = auVar91 * auVar213 + ZEXT816(0x1000003d1) * auVar216;
          uVar317 = auVar3._0_8_;
          auStack_360._112_8_ = uVar317 & 0xfffffffffffff;
          auVar285._8_8_ = 0;
          auVar285._0_8_ = uVar317 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar311 * 2;
          auVar217._8_8_ = 0;
          auVar217._0_8_ = uVar314;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = psVar319;
          auVar218._8_8_ = 0;
          auVar218._0_8_ = b;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar307;
          auVar219._8_8_ = 0;
          auVar219._0_8_ = uVar307;
          auVar4 = auVar95 * auVar218 + auVar286 + auVar96 * auVar219;
          uVar317 = auVar4._0_8_;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar317 & 0xfffffffffffff;
          auVar3 = auVar94 * auVar217 + auVar285 + auVar97 * ZEXT816(0x1000003d10);
          uVar318 = auVar3._0_8_;
          auVar288._8_8_ = 0;
          auVar288._0_8_ = uVar317 >> 0x34 | auVar4._8_8_ << 0xc;
          uStack_2e8 = uVar318 & 0xfffffffffffff;
          auVar287._8_8_ = 0;
          auVar287._0_8_ = uVar318 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar311 * 2;
          auVar220._8_8_ = 0;
          auVar220._0_8_ = psVar319;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar314;
          auVar221._8_8_ = 0;
          auVar221._0_8_ = uVar314;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar307;
          auVar222._8_8_ = 0;
          auVar222._0_8_ = b;
          auVar288 = auVar100 * auVar222 + auVar288;
          uVar311 = auVar288._0_8_;
          psVar310 = auVar288._8_8_;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar311 & 0xfffffffffffff;
          auVar3 = auVar98 * auVar220 + auVar287 + auVar99 * auVar221 +
                   auVar101 * ZEXT816(0x1000003d10);
          uVar314 = auVar3._0_8_;
          r = (secp256k1_context *)(uVar311 >> 0x34 | (long)psVar310 << 0xc);
          uStack_2e0 = uVar314 & 0xfffffffffffff;
          auVar289._8_8_ = 0;
          auVar289._0_8_ = (uVar314 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_250._0_8_;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = r;
          auVar289 = auVar102 * ZEXT816(0x1000003d10) + auVar289;
          uVar311 = auVar289._0_8_;
          uStack_2d8 = uVar311 & 0xfffffffffffff;
          psStack_2d0 = (secp256k1_context *)
                        ((long)(a_01->ecmult_gen_ctx).blind.d +
                        ((uVar311 >> 0x34 | auVar289._8_8_ << 0xc) - 8));
          uStack_2c8 = 1;
          psStack_398 = (secp256k1_context *)0x1258a3;
          auStack_360._48_8_ = a_01;
          secp256k1_fe_verify((secp256k1_fe *)a_00);
          psStack_398 = (secp256k1_context *)0x1258ab;
          ctx = a_00;
          secp256k1_fe_verify((secp256k1_fe *)a_00);
          if (4 < (int)uStack_2c8) goto LAB_00125fd2;
          psVar310 = (secp256k1_context *)(ulong)(uint)((int)uStack_2c8 * 7);
          r = (secp256k1_context *)(auStack_360 + 0x70);
          auStack_360._112_8_ = auStack_360._112_8_ * 7;
          uStack_2e8 = uStack_2e8 * 7;
          uStack_2e0 = uStack_2e0 * 7;
          uStack_2d8 = uStack_2d8 * 7;
          psStack_2d0 = (secp256k1_context *)((long)psStack_2d0 * 7);
          uStack_2c8 = (ulong)(uint)((int)uStack_2c8 * 7);
          psStack_398 = (secp256k1_context *)0x125937;
          secp256k1_fe_verify((secp256k1_fe *)r);
          b = psStack_388;
          psStack_398 = (secp256k1_context *)0x12594a;
          a_01 = r;
          secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,(secp256k1_fe *)psStack_388);
          psStack_398 = (secp256k1_context *)0x125957;
          secp256k1_fe_verify((secp256k1_fe *)auStack_360);
          psStack_398 = (secp256k1_context *)0x12595f;
          ctx = r;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psVar316 = (secp256k1_fe *)psStack_380;
          psVar322 = psStack_380;
          if ((int)uStack_2c8 + auStack_360._40_4_ < 0x21) {
            auStack_360._0_8_ = auStack_360._0_8_ + auStack_360._112_8_;
            auStack_360._8_8_ = auStack_360._8_8_ + uStack_2e8;
            auStack_360._16_8_ =
                 (long)(((secp256k1_ecmult_gen_context *)auStack_360._16_8_)->blind).d +
                 (uStack_2e0 - 8);
            auStack_360._24_8_ = auStack_360._24_8_ + uStack_2d8;
            auStack_360._32_8_ =
                 (long)((secp256k1_fe *)(auStack_360._32_8_ + -8))->n +
                 (long)(psStack_2d0->ecmult_gen_ctx).blind.d;
            auStack_360._44_4_ = 0;
            auStack_360._40_4_ = (int)uStack_2c8 + auStack_360._40_4_;
            psStack_398 = (secp256k1_context *)0x1259bb;
            psVar310 = psStack_2d0;
            secp256k1_fe_verify((secp256k1_fe *)auStack_360);
            if (iStack_38c == 0) {
              psVar313 = (secp256k1_fe *)auStack_250;
              psStack_398 = (secp256k1_context *)0x1259da;
              secp256k1_fe_mul(psVar313,(secp256k1_fe *)auStack_360,(secp256k1_fe *)b);
              goto LAB_00125a0e;
            }
            goto LAB_00125a1b;
          }
        }
        else {
          psStack_398 = (secp256k1_context *)0x125fb4;
          secp256k1_ecmult_const_xonly_cold_9();
          psVar319 = (secp256k1_context *)psVar316;
          b = a;
LAB_00125fb4:
          uVar311 = uVar307;
          psVar321 = psVar319;
          psStack_398 = (secp256k1_context *)0x125fb9;
          secp256k1_ecmult_const_xonly_cold_8();
LAB_00125fb9:
          psStack_398 = (secp256k1_context *)0x125fbe;
          secp256k1_ecmult_const_xonly_cold_7();
LAB_00125fbe:
          psStack_398 = (secp256k1_context *)0x125fc3;
          secp256k1_ecmult_const_xonly_cold_5();
LAB_00125fc3:
          psStack_398 = (secp256k1_context *)0x125fc8;
          secp256k1_ecmult_const_xonly_cold_6();
LAB_00125fc8:
          psStack_398 = (secp256k1_context *)0x125fcd;
          secp256k1_ecmult_const_xonly_cold_1();
          psVar319 = psVar321;
          uVar307 = uVar311;
LAB_00125fcd:
          psStack_398 = (secp256k1_context *)0x125fd2;
          secp256k1_ecmult_const_xonly_cold_4();
LAB_00125fd2:
          psStack_398 = (secp256k1_context *)0x125fd7;
          secp256k1_ecmult_const_xonly_cold_3();
        }
        psStack_398 = (secp256k1_context *)ecdsa_signature_parse_der_lax;
        secp256k1_ecmult_const_xonly_cold_2();
        auStack_408[0x30] = '\0';
        auStack_408[0x31] = '\0';
        auStack_408[0x32] = '\0';
        auStack_408[0x33] = '\0';
        auStack_408[0x34] = '\0';
        auStack_408[0x35] = '\0';
        auStack_408[0x36] = '\0';
        auStack_408[0x37] = '\0';
        auStack_408[0x38] = '\0';
        auStack_408[0x39] = '\0';
        auStack_408[0x3a] = '\0';
        auStack_408[0x3b] = '\0';
        auStack_408[0x3c] = '\0';
        auStack_408[0x3d] = '\0';
        auStack_408[0x3e] = '\0';
        auStack_408[0x3f] = '\0';
        auStack_408[0x20] = '\0';
        auStack_408[0x21] = '\0';
        auStack_408[0x22] = '\0';
        auStack_408[0x23] = '\0';
        auStack_408[0x24] = '\0';
        auStack_408[0x25] = '\0';
        auStack_408[0x26] = '\0';
        auStack_408[0x27] = '\0';
        auStack_408[0x28] = '\0';
        auStack_408[0x29] = '\0';
        auStack_408[0x2a] = '\0';
        auStack_408[0x2b] = '\0';
        auStack_408[0x2c] = '\0';
        auStack_408[0x2d] = '\0';
        auStack_408[0x2e] = '\0';
        auStack_408[0x2f] = '\0';
        auStack_408[0x10] = '\0';
        auStack_408[0x11] = '\0';
        auStack_408[0x12] = '\0';
        auStack_408[0x13] = '\0';
        auStack_408[0x14] = '\0';
        auStack_408[0x15] = '\0';
        auStack_408[0x16] = '\0';
        auStack_408[0x17] = '\0';
        auStack_408[0x18] = '\0';
        auStack_408[0x19] = '\0';
        auStack_408[0x1a] = '\0';
        auStack_408[0x1b] = '\0';
        auStack_408[0x1c] = '\0';
        auStack_408[0x1d] = '\0';
        auStack_408[0x1e] = '\0';
        auStack_408[0x1f] = '\0';
        auStack_408[0] = '\0';
        auStack_408[1] = '\0';
        auStack_408[2] = '\0';
        auStack_408[3] = '\0';
        auStack_408[4] = '\0';
        auStack_408[5] = '\0';
        auStack_408[6] = '\0';
        auStack_408[7] = '\0';
        auStack_408[8] = '\0';
        auStack_408[9] = '\0';
        auStack_408[10] = '\0';
        auStack_408[0xb] = '\0';
        auStack_408[0xc] = '\0';
        auStack_408[0xd] = '\0';
        auStack_408[0xe] = '\0';
        auStack_408[0xf] = '\0';
        psStack_3c0 = r;
        psStack_3b8 = psVar319;
        uStack_3b0 = uVar307;
        psStack_3a8 = b;
        psStack_3a0 = psVar322;
        psStack_398 = a_00;
        secp256k1_ecdsa_signature_parse_compact(ctx,(secp256k1_ecdsa_signature *)a_01,auStack_408);
        if (psVar310 == (secp256k1_context *)0x0) {
          return;
        }
        if (psVar310 == (secp256k1_context *)0x1) {
          return;
        }
        if (*extraout_RDX != '0') {
          return;
        }
        bVar2 = extraout_RDX[1];
        psVar319 = (secp256k1_context *)0x2;
        if ((char)bVar2 < '\0') {
          if (&psVar310[-1].field_0xe6 < (undefined1 *)((ulong)bVar2 - 0x80)) {
            return;
          }
          psVar319 = (secp256k1_context *)((ulong)bVar2 - 0x7e);
        }
        if (psVar319 == psVar310) {
          return;
        }
        if (extraout_RDX[(long)psVar319] != '\x02') {
          return;
        }
        if ((secp256k1_context *)((long)&(psVar319->ecmult_gen_ctx).built + 1) == psVar310) {
          return;
        }
        psVar322 = (secp256k1_context *)((long)&(psVar319->ecmult_gen_ctx).built + 2);
        __n = (size_t)(byte)(extraout_RDX + 1)[(long)psVar319];
        if (-1 < (extraout_RDX + 1)[(long)psVar319]) goto LAB_00126092;
        uVar307 = __n - 0x80;
        if ((ulong)((long)psVar310 - (long)psVar322) < uVar307) {
          return;
        }
        if (uVar307 == 0) goto LAB_00126134;
        break;
      }
    }
    else {
LAB_00125239:
      psStack_1c0 = (secp256k1_fe *)0x12523e;
      secp256k1_ellswift_xswiftec_frac_var_cold_12();
LAB_0012523e:
      psStack_1c0 = (secp256k1_fe *)0x125243;
      secp256k1_ellswift_xswiftec_frac_var_cold_11();
LAB_00125243:
      psStack_1c0 = (secp256k1_fe *)0x125248;
      secp256k1_ellswift_xswiftec_frac_var_cold_10();
LAB_00125248:
      psStack_1c0 = (secp256k1_fe *)0x12524d;
      secp256k1_ellswift_xswiftec_frac_var_cold_9();
LAB_0012524d:
      psStack_1c0 = (secp256k1_fe *)0x125252;
      secp256k1_ellswift_xswiftec_frac_var_cold_8();
LAB_00125252:
      psStack_1c0 = (secp256k1_fe *)0x125257;
      secp256k1_ellswift_xswiftec_frac_var_cold_7();
    }
    psStack_1c0 = (secp256k1_fe *)0x12525c;
    secp256k1_ellswift_xswiftec_frac_var_cold_6();
LAB_0012525c:
    local_138._80_8_ = 0;
    local_138._88_4_ = 1;
    local_138._92_4_ = 1;
    local_138._64_8_ = 0;
    local_138._72_8_ = 0;
    local_138._48_8_ = 1;
    local_138._56_8_ = 0;
  } while( true );
  while( true ) {
    psVar322 = (secp256k1_context *)((long)&(psVar322->ecmult_gen_ctx).built + 1);
    uVar307 = uVar307 - 1;
    if (uVar307 == 0) break;
    if (extraout_RDX[(long)psVar322] != '\0') goto LAB_00126134;
  }
  uVar307 = 0;
  psVar322 = (secp256k1_context *)((long)psVar319 + (__n - 0x7e));
LAB_00126134:
  if (uVar307 < 8) {
    if (uVar307 == 0) {
      __n = 0;
    }
    else {
      uVar311 = 0;
      __n = 0;
      do {
        __n = (ulong)(byte)(extraout_RDX + (long)psVar322)[uVar311] | __n << 8;
        uVar311 = uVar311 + 1;
      } while (uVar307 != uVar311);
      psVar322 = (secp256k1_context *)((long)(psVar322->ecmult_gen_ctx).blind.d + (uVar307 - 8));
    }
LAB_00126092:
    if ((((__n <= (ulong)((long)psVar310 - (long)psVar322)) &&
         (psVar319 = (secp256k1_context *)((long)(psVar322->ecmult_gen_ctx).blind.d + (__n - 8)),
         psVar319 != psVar310)) && (extraout_RDX[(long)psVar319] == '\x02')) &&
       ((secp256k1_context *)((long)&(psVar319->ecmult_gen_ctx).built + 1) != psVar310)) {
      puVar320 = (undefined1 *)((long)&(psVar319->ecmult_gen_ctx).built + 2);
      uVar307 = (ulong)(byte)(extraout_RDX + 1)[(long)psVar319];
      if ((extraout_RDX + 1)[(long)psVar319] < '\0') {
        uVar311 = uVar307 - 0x80;
        if ((ulong)((long)psVar310 - (long)puVar320) < uVar311) {
          return;
        }
        if (uVar311 != 0) {
          do {
            if (extraout_RDX[(long)puVar320] != '\0') goto LAB_00126293;
            puVar320 = puVar320 + 1;
            uVar311 = uVar311 - 1;
          } while (uVar311 != 0);
          uVar311 = 0;
          puVar320 = (undefined1 *)((long)psVar322 + uVar307 + __n + -0x7e);
        }
LAB_00126293:
        if (7 < uVar311) {
          return;
        }
        if (uVar311 == 0) {
          uVar307 = 0;
        }
        else {
          uVar314 = 0;
          uVar307 = 0;
          do {
            uVar307 = (ulong)(byte)(extraout_RDX + (long)puVar320)[uVar314] | uVar307 << 8;
            uVar314 = uVar314 + 1;
          } while (uVar311 != uVar314);
          puVar320 = puVar320 + uVar311;
        }
      }
      if (uVar307 <= (ulong)((long)psVar310 - (long)puVar320)) {
        if (__n != 0) {
          do {
            if (extraout_RDX[(long)psVar322] != '\0') goto LAB_001261be;
            psVar322 = (secp256k1_context *)((long)&(psVar322->ecmult_gen_ctx).built + 1);
            __n = __n - 1;
          } while (__n != 0);
          __n = 0;
          psVar322 = psVar319;
        }
LAB_001261be:
        bVar323 = 0xffffffffffffffdf < __n - 0x21;
        if (bVar323) {
          memcpy(auStack_408 + (0x20 - __n),extraout_RDX + (long)&psVar322->ecmult_gen_ctx,__n);
        }
        bVar323 = !bVar323 && 0x20 < __n;
        if (uVar307 != 0) {
          puVar1 = puVar320 + uVar307;
          do {
            if (extraout_RDX[(long)puVar320] != '\0') goto LAB_00126211;
            puVar320 = puVar320 + 1;
            uVar307 = uVar307 - 1;
          } while (uVar307 != 0);
          uVar307 = 0;
          puVar320 = puVar1;
        }
LAB_00126211:
        bVar304 = 0x20 < uVar307 || bVar323;
        if (0xffffffffffffffdf < uVar307 - 0x21) {
          memcpy(auStack_408 + (0x40 - uVar307),extraout_RDX + (long)puVar320,uVar307);
          bVar304 = bVar323;
        }
        if ((bVar304) ||
           (iVar306 = secp256k1_ecdsa_signature_parse_compact
                                (ctx,(secp256k1_ecdsa_signature *)a_01,auStack_408), iVar306 == 0))
        {
          auStack_408[0x30] = '\0';
          auStack_408[0x31] = '\0';
          auStack_408[0x32] = '\0';
          auStack_408[0x33] = '\0';
          auStack_408[0x34] = '\0';
          auStack_408[0x35] = '\0';
          auStack_408[0x36] = '\0';
          auStack_408[0x37] = '\0';
          auStack_408[0x38] = '\0';
          auStack_408[0x39] = '\0';
          auStack_408[0x3a] = '\0';
          auStack_408[0x3b] = '\0';
          auStack_408[0x3c] = '\0';
          auStack_408[0x3d] = '\0';
          auStack_408[0x3e] = '\0';
          auStack_408[0x3f] = '\0';
          auStack_408[0x20] = '\0';
          auStack_408[0x21] = '\0';
          auStack_408[0x22] = '\0';
          auStack_408[0x23] = '\0';
          auStack_408[0x24] = '\0';
          auStack_408[0x25] = '\0';
          auStack_408[0x26] = '\0';
          auStack_408[0x27] = '\0';
          auStack_408[0x28] = '\0';
          auStack_408[0x29] = '\0';
          auStack_408[0x2a] = '\0';
          auStack_408[0x2b] = '\0';
          auStack_408[0x2c] = '\0';
          auStack_408[0x2d] = '\0';
          auStack_408[0x2e] = '\0';
          auStack_408[0x2f] = '\0';
          auStack_408[0x10] = '\0';
          auStack_408[0x11] = '\0';
          auStack_408[0x12] = '\0';
          auStack_408[0x13] = '\0';
          auStack_408[0x14] = '\0';
          auStack_408[0x15] = '\0';
          auStack_408[0x16] = '\0';
          auStack_408[0x17] = '\0';
          auStack_408[0x18] = '\0';
          auStack_408[0x19] = '\0';
          auStack_408[0x1a] = '\0';
          auStack_408[0x1b] = '\0';
          auStack_408[0x1c] = '\0';
          auStack_408[0x1d] = '\0';
          auStack_408[0x1e] = '\0';
          auStack_408[0x1f] = '\0';
          auStack_408[0] = '\0';
          auStack_408[1] = '\0';
          auStack_408[2] = '\0';
          auStack_408[3] = '\0';
          auStack_408[4] = '\0';
          auStack_408[5] = '\0';
          auStack_408[6] = '\0';
          auStack_408[7] = '\0';
          auStack_408[8] = '\0';
          auStack_408[9] = '\0';
          auStack_408[10] = '\0';
          auStack_408[0xb] = '\0';
          auStack_408[0xc] = '\0';
          auStack_408[0xd] = '\0';
          auStack_408[0xe] = '\0';
          auStack_408[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(ctx,(secp256k1_ecdsa_signature *)a_01,auStack_408)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
#endif
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}